

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O1

Message * __thiscall
google::protobuf::Reflection::MutableMessage
          (Reflection *this,Message *message,FieldDescriptor *field,MessageFactory *factory)

{
  long lVar1;
  uint32 uVar2;
  MessageLite *pMVar3;
  LogMessage *other;
  Message **ppMVar4;
  undefined8 *puVar5;
  Message *pMVar6;
  void *pvVar7;
  LogMessage local_80;
  FieldDescriptor *local_48;
  ReflectionSchema *local_40;
  undefined4 local_34;
  
  if (*(Descriptor **)(field + 0x50) != this->descriptor_) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"MutableMessage","Field does not match message type.");
  }
  if (*(int *)(field + 0x3c) == 3) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"MutableMessage",
               "Field is repeated; the method requires a singular field.");
  }
  if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
    local_80._0_8_ = FieldDescriptor::TypeOnceInit;
    local_48 = field;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(field + 0x30),(_func_void_FieldDescriptor_ptr **)&local_80,&local_48)
    ;
  }
  if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(field + 0x38) * 4) != 10) {
    anon_unknown_0::ReportReflectionUsageTypeError
              (this->descriptor_,field,"MutableMessage",CPPTYPE_MESSAGE);
  }
  if (field[0x43] == (FieldDescriptor)0x1) {
    if (factory == (MessageFactory *)0x0) {
      factory = this->message_factory_;
    }
    uVar2 = internal::ReflectionSchema::GetExtensionSetOffset(&this->schema_);
    pMVar3 = internal::ExtensionSet::MutableMessage
                       ((ExtensionSet *)
                        ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar2),field
                        ,factory);
  }
  else {
    local_40 = &this->schema_;
    uVar2 = internal::ReflectionSchema::GetFieldOffset(local_40,field);
    ppMVar4 = (Message **)((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar2);
    lVar1 = *(long *)(field + 0x58);
    if ((lVar1 == 0) ||
       ((*(int *)(lVar1 + 0x18) == 1 && (*(char *)(**(long **)(lVar1 + 0x20) + 0x41) != '\0')))) {
      SetBit(this,message,field);
    }
    else {
      if (*(int *)(lVar1 + 0x18) == 1) {
        local_34 = (undefined4)
                   CONCAT71((int7)((ulong)**(long **)(lVar1 + 0x20) >> 8),
                            *(undefined1 *)(**(long **)(lVar1 + 0x20) + 0x41));
      }
      else {
        local_34 = 0;
      }
      if ((char)local_34 != '\0') {
        internal::LogMessage::LogMessage
                  (&local_80,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/generated_message_reflection.cc"
                   ,0x761);
        other = internal::LogMessage::operator<<
                          (&local_80,"CHECK failed: !oneof_descriptor->is_synthetic(): ");
        internal::LogFinisher::operator=((LogFinisher *)&local_48,other);
        if ((char)local_34 != '\0') {
          internal::LogMessage::~LogMessage(&local_80);
        }
      }
      if (*(int *)((long)&(message->super_MessageLite)._vptr_MessageLite +
                  (ulong)(uint)((int)((ulong)(lVar1 - *(long *)(*(long *)(lVar1 + 0x10) + 0x30)) >>
                                     4) * -0x55555554 + (this->schema_).oneof_case_offset_)) !=
          *(int *)(field + 0x44)) {
        ClearOneof(this,message,*(OneofDescriptor **)(field + 0x58));
        ppMVar4 = MutableField<google::protobuf::Message*>(this,message,field);
        puVar5 = (undefined8 *)internal::ReflectionSchema::GetFieldDefault(local_40,field);
        pvVar7 = (message->super_MessageLite)._internal_metadata_.ptr_;
        if (((ulong)pvVar7 & 1) != 0) {
          pvVar7 = *(void **)((ulong)pvVar7 & 0xfffffffffffffffe);
        }
        pMVar6 = (Message *)(**(code **)(*(long *)*puVar5 + 0x20))((long *)*puVar5,pvVar7);
        *ppMVar4 = pMVar6;
      }
    }
    if (*ppMVar4 == (Message *)0x0) {
      puVar5 = (undefined8 *)internal::ReflectionSchema::GetFieldDefault(local_40,field);
      pvVar7 = (message->super_MessageLite)._internal_metadata_.ptr_;
      if (((ulong)pvVar7 & 1) != 0) {
        pvVar7 = *(void **)((ulong)pvVar7 & 0xfffffffffffffffe);
      }
      pMVar6 = (Message *)(**(code **)(*(long *)*puVar5 + 0x20))((long *)*puVar5,pvVar7);
      *ppMVar4 = pMVar6;
    }
    pMVar3 = &(*ppMVar4)->super_MessageLite;
  }
  return (Message *)pMVar3;
}

Assistant:

Message* Reflection::MutableMessage(Message* message,
                                    const FieldDescriptor* field,
                                    MessageFactory* factory) const {
  USAGE_CHECK_ALL(MutableMessage, SINGULAR, MESSAGE);

  if (factory == nullptr) factory = message_factory_;

  if (field->is_extension()) {
    return static_cast<Message*>(
        MutableExtensionSet(message)->MutableMessage(field, factory));
  } else {
    Message* result;

    Message** result_holder = MutableRaw<Message*>(message, field);

    if (schema_.InRealOneof(field)) {
      if (!HasOneofField(*message, field)) {
        ClearOneof(message, field->containing_oneof());
        result_holder = MutableField<Message*>(message, field);
        const Message* default_message = DefaultRaw<const Message*>(field);
        *result_holder = default_message->New(message->GetArena());
      }
    } else {
      SetBit(message, field);
    }

    if (*result_holder == nullptr) {
      const Message* default_message = DefaultRaw<const Message*>(field);
      *result_holder = default_message->New(message->GetArena());
    }
    result = *result_holder;
    return result;
  }
}